

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdDmaZcull::emulate_mthd(MthdDmaZcull *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool local_41;
  byte local_31;
  bool local_22;
  bool prot_err;
  bool bad;
  uint32_t dcls;
  uint32_t limit;
  uint32_t base;
  uint32_t offset_mask;
  MthdDmaZcull *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.pobj[2];
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[0] >> 0x14;
  uVar4 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x34) >> 0x34);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_zcull =
       (this->super_SingleMthdTest).super_MthdTest.pobj[1] & 0x3fffffff |
       (uint)(uVar4 != 0x30) << 0x1f;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_zcull =
       uVar1 & 0x3ffff000 | uVar2;
  pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x2d,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_base_zcull,false);
  pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x2e,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_limit_zcull,true);
  bVar3 = true;
  if ((uVar4 == 0x30) || (uVar4 == 0x3d)) {
    bVar3 = false;
  }
  if ((uVar4 == 3) &&
     (((this->super_SingleMthdTest).super_MthdTest.cls == 0x38 ||
      ((this->super_SingleMthdTest).super_MthdTest.cls == 0x88)))) {
    bVar3 = false;
  }
  if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d << 0x28
             ) < 0) && (bVar3)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  local_22 = ((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x2e) >> 0x3e != 0 ||
             (uVar2 & 0x3f) != 0;
  if (uVar4 == 0x30) {
    local_22 = false;
  }
  if (local_22) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4);
  }
  local_31 = 0;
  if (uVar4 != 0x30) {
    local_41 = false;
    if (bVar3) {
      local_41 = (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                               debug_d << 0x28) < 0;
    }
    local_31 = local_41 ^ 0xff;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xdfffffff |
       (uint)(local_31 & 1) << 0x1d;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t offset_mask = 0x3fffffff;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		exp.bundle_surf_limit_zcull = (limit & offset_mask) | (dcls != 0x30) << 31;
		exp.bundle_surf_base_zcull = base & offset_mask;
		pgraph_celsius_icmd(&exp, 0x2d, exp.bundle_surf_base_zcull, false);
		pgraph_celsius_icmd(&exp, 0x2e, exp.bundle_surf_limit_zcull, true);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (dcls == 3 && (cls == 0x38 || cls == 0x88))
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 6))
			prot_err = true;
		if (extr(pobj[0], 16, 2))
			prot_err = true;
		if (dcls == 0x30)
			prot_err = false;
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.ctx_valid, 29, 1, dcls != 0x30 && !(bad && extr(exp.debug_d, 23, 1)));
	}